

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExponentiallyDecayingReservoir.cc
# Opt level: O3

shared_ptr<cppmetrics::Snapshot> __thiscall
cppmetrics::ExponentiallyDecayingReservoir::get_snapshot(ExponentiallyDecayingReservoir *this)

{
  int iVar1;
  _Base_ptr p_Var2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ExponentiallyDecayingReservoir *in_RSI;
  _Rb_tree_header *p_Var3;
  shared_ptr<cppmetrics::Snapshot> sVar4;
  vector<cppmetrics::WeightedSample,_std::allocator<cppmetrics::WeightedSample>_> samples;
  undefined1 local_69;
  vector<cppmetrics::WeightedSample,_std::allocator<cppmetrics::WeightedSample>_> local_68;
  WeightedSample local_48;
  
  rescale_if_needed(in_RSI);
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&in_RSI->m_mutex);
  if (iVar1 == 0) {
    local_68.
    super__Vector_base<cppmetrics::WeightedSample,_std::allocator<cppmetrics::WeightedSample>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.
    super__Vector_base<cppmetrics::WeightedSample,_std::allocator<cppmetrics::WeightedSample>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.
    super__Vector_base<cppmetrics::WeightedSample,_std::allocator<cppmetrics::WeightedSample>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<cppmetrics::WeightedSample,_std::allocator<cppmetrics::WeightedSample>_>::reserve
              (&local_68,(in_RSI->m_samples)._M_t._M_impl.super__Rb_tree_header._M_node_count);
    p_Var2 = (in_RSI->m_samples)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var3 = &(in_RSI->m_samples)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var2 != p_Var3) {
      do {
        WeightedSample::WeightedSample(&local_48,(WeightedSample *)&p_Var2[1]._M_parent);
        std::vector<cppmetrics::WeightedSample,_std::allocator<cppmetrics::WeightedSample>_>::
        emplace_back<cppmetrics::WeightedSample>(&local_68,&local_48);
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
      } while ((_Rb_tree_header *)p_Var2 != p_Var3);
    }
    local_48.m_value = 0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<cppmetrics::WeightedSnapshot,std::allocator<cppmetrics::WeightedSnapshot>,std::vector<cppmetrics::WeightedSample,std::allocator<cppmetrics::WeightedSample>>>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_48.m_weight,
               (WeightedSnapshot **)&local_48,(allocator<cppmetrics::WeightedSnapshot> *)&local_69,
               &local_68);
    (this->super_Reservoir)._vptr_Reservoir = (_func_int **)local_48.m_value;
    (this->m_mutex).super___mutex_base._M_mutex.__align = (long)local_48.m_weight;
    if (local_68.
        super__Vector_base<cppmetrics::WeightedSample,_std::allocator<cppmetrics::WeightedSample>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.
                      super__Vector_base<cppmetrics::WeightedSample,_std::allocator<cppmetrics::WeightedSample>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_68.
                            super__Vector_base<cppmetrics::WeightedSample,_std::allocator<cppmetrics::WeightedSample>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.
                            super__Vector_base<cppmetrics::WeightedSample,_std::allocator<cppmetrics::WeightedSample>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&in_RSI->m_mutex);
    sVar4.super___shared_ptr<cppmetrics::Snapshot,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar4.super___shared_ptr<cppmetrics::Snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<cppmetrics::Snapshot>)
           sVar4.super___shared_ptr<cppmetrics::Snapshot,_(__gnu_cxx::_Lock_policy)2>;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

std::shared_ptr<Snapshot> ExponentiallyDecayingReservoir::get_snapshot()
{
  rescale_if_needed();

  std::lock_guard<std::mutex> lock(m_mutex);

  std::vector<WeightedSample> samples;
  samples.reserve(m_samples.size());
  std::transform(
      std::begin(m_samples), std::end(m_samples), std::back_inserter(samples),
      [](auto&& pair) { return pair.second; }
  );
  return std::make_shared<WeightedSnapshot>(std::move(samples));
}